

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

Matrix<double,_1,__1,_1,_1,__1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
lazyAssign<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>>
          (PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *this,
          DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *other)

{
  Matrix<double,_1,__1,_1,_1,__1> *pMVar1;
  
  resizeLike<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>>
            (this,(EigenBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                  other);
  pMVar1 = DenseBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
           lazyAssign<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>>
                     ((DenseBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)this,other);
  return pMVar1;
}

Assistant:

EIGEN_STRONG_INLINE Derived& lazyAssign(const DenseBase<OtherDerived>& other)
    {
      _resize_to_match(other);
      return Base::lazyAssign(other.derived());
    }